

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O0

void Bmcg_ManAddCnf(Bmcg_Man_t *p,bmcg_sat_solver *pSat,Cnf_Dat_t *pCnf)

{
  int iVar1;
  abctime aVar2;
  Gia_Obj_t *pGVar3;
  abctime aVar4;
  int iSatVar_2;
  Gia_Obj_t *pObj_1;
  int iSatVar_1;
  Gia_Obj_t *pObj;
  abctime clk;
  int iSatVar;
  int i;
  Cnf_Dat_t *pCnf_local;
  bmcg_sat_solver *pSat_local;
  Bmcg_Man_t *p_local;
  
  aVar2 = Abc_Clock();
  bmcg_sat_solver_set_nvars(pSat,p->nSatVars);
  if (p->pPars->fUseEliminate != 0) {
    for (clk._4_4_ = p->nOldFrPis; iVar1 = Gia_ManPiNum(p->pFrames), clk._4_4_ < iVar1;
        clk._4_4_ = clk._4_4_ + 1) {
      pGVar3 = Gia_ManPi(p->pFrames,clk._4_4_);
      iVar1 = Gia_ObjId(p->pFrames,pGVar3);
      iVar1 = Vec_IntEntry(&p->vFr2Sat,iVar1);
      if (0 < iVar1) {
        bmcg_sat_solver_var_set_frozen(pSat,iVar1,1);
      }
    }
    for (clk._4_4_ = p->nOldFrPos; iVar1 = Gia_ManPoNum(p->pFrames), clk._4_4_ < iVar1;
        clk._4_4_ = clk._4_4_ + 1) {
      pGVar3 = Gia_ManPo(p->pFrames,clk._4_4_);
      iVar1 = Gia_ObjId(p->pFrames,pGVar3);
      iVar1 = Vec_IntEntry(&p->vFr2Sat,iVar1);
      if (0 < iVar1) {
        bmcg_sat_solver_var_set_frozen(pSat,iVar1,1);
      }
    }
    iVar1 = Gia_ManPiNum(p->pFrames);
    p->nOldFrPis = iVar1;
    iVar1 = Gia_ManPoNum(p->pFrames);
    p->nOldFrPos = iVar1;
  }
  clk._4_4_ = 0;
  while( true ) {
    if (pCnf->nClauses <= clk._4_4_) {
      if (p->pPars->fUseEliminate != 0) {
        bmcg_sat_solver_eliminate(pSat,0);
        for (clk._4_4_ = 0; iVar1 = Vec_IntSize(&p->vFr2Sat), clk._4_4_ < iVar1;
            clk._4_4_ = clk._4_4_ + 1) {
          iVar1 = Vec_IntEntry(&p->vFr2Sat,clk._4_4_);
          if ((0 < iVar1) && (iVar1 = bmcg_sat_solver_var_is_elim(pSat,iVar1), iVar1 != 0)) {
            Vec_IntWriteEntry(&p->vFr2Sat,clk._4_4_,-1);
          }
        }
        aVar4 = Abc_Clock();
        p->timeSmp = (aVar4 - aVar2) + p->timeSmp;
      }
      return;
    }
    iVar1 = bmcg_sat_solver_addclause
                      (pSat,pCnf->pClauses[clk._4_4_],
                       (int)((long)pCnf->pClauses[clk._4_4_ + 1] - (long)pCnf->pClauses[clk._4_4_]
                            >> 2));
    if (iVar1 == 0) break;
    clk._4_4_ = clk._4_4_ + 1;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcG.c"
                ,0x15c,"void Bmcg_ManAddCnf(Bmcg_Man_t *, bmcg_sat_solver *, Cnf_Dat_t *)");
}

Assistant:

void Bmcg_ManAddCnf( Bmcg_Man_t * p, bmcg_sat_solver * pSat, Cnf_Dat_t * pCnf )
{
    int i, iSatVar;
    abctime clk = Abc_Clock();
    bmcg_sat_solver_set_nvars( pSat, p->nSatVars );
    if ( p->pPars->fUseEliminate )
    {
        for ( i = p->nOldFrPis; i < Gia_ManPiNum(p->pFrames); i++ )
        {
            Gia_Obj_t * pObj = Gia_ManPi( p->pFrames, i );
            int iSatVar = Vec_IntEntry( &p->vFr2Sat, Gia_ObjId(p->pFrames, pObj) );
            if ( iSatVar > 0 )
                bmcg_sat_solver_var_set_frozen( pSat, iSatVar, 1 );
        }
        for ( i = p->nOldFrPos; i < Gia_ManPoNum(p->pFrames); i++ )
        {
            Gia_Obj_t * pObj = Gia_ManPo( p->pFrames, i );
            int iSatVar = Vec_IntEntry( &p->vFr2Sat, Gia_ObjId(p->pFrames, pObj) );
            if ( iSatVar > 0 )
                bmcg_sat_solver_var_set_frozen( pSat, iSatVar, 1 );
        }
        p->nOldFrPis = Gia_ManPiNum(p->pFrames);
        p->nOldFrPos = Gia_ManPoNum(p->pFrames);
    }
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !bmcg_sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
            assert( 0 );
    if ( !p->pPars->fUseEliminate )
        return;
    bmcg_sat_solver_eliminate( pSat, 0 );
    Vec_IntForEachEntry( &p->vFr2Sat, iSatVar, i )
        if ( iSatVar > 0 && bmcg_sat_solver_var_is_elim(pSat, iSatVar) )
            Vec_IntWriteEntry( &p->vFr2Sat, i, -1 );
    p->timeSmp += Abc_Clock() - clk;
}